

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_conv_2d(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
            int d1)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *b_00;
  
  pgVar1 = ggml_im2col(ctx,a,b,s0,s1,p0,p1,d0,d1,true,a->type);
  pgVar2 = ggml_reshape_2d(ctx,pgVar1,pgVar1->ne[0],pgVar1->ne[2] * pgVar1->ne[3] * pgVar1->ne[1]);
  b_00 = ggml_reshape_2d(ctx,a,a->ne[1] * a->ne[0] * a->ne[2],a->ne[3]);
  pgVar2 = ggml_mul_mat(ctx,pgVar2,b_00);
  pgVar1 = ggml_reshape_4d(ctx,pgVar2,pgVar1->ne[1],pgVar1->ne[2],pgVar1->ne[3],a->ne[3]);
  pgVar1 = ggml_permute(ctx,pgVar1,0,1,3,2);
  pgVar1 = ggml_cont(ctx,pgVar1);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_conv_2d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1) {
    struct ggml_tensor * im2col = ggml_im2col(ctx, a, b, s0, s1, p0, p1, d0, d1, true, a->type); // [N, OH, OW, IC * KH * KW]

    struct ggml_tensor * result =
        ggml_mul_mat(ctx,
                ggml_reshape_2d(ctx, im2col, im2col->ne[0],  im2col->ne[3] * im2col->ne[2] * im2col->ne[1]), // [N, OH, OW, IC * KH * KW] => [N*OH*OW, IC * KH * KW]
                ggml_reshape_2d(ctx, a, (a->ne[0] * a->ne[1] * a->ne[2]),  a->ne[3]));                       // [OC，IC, KH, KW] => [OC, IC * KH * KW]

    result = ggml_reshape_4d(ctx, result, im2col->ne[1], im2col->ne[2], im2col->ne[3], a->ne[3]); // [OC, N, OH, OW]
    result = ggml_cont(ctx, ggml_permute(ctx, result, 0, 1, 3, 2)); // [N, OC, OH, OW]


    return result;
}